

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O2

Fxu_Pair * Fxu_PairAlloc(Fxu_Matrix *p,Fxu_Cube *pCube1,Fxu_Cube *pCube2)

{
  Fxu_Pair *pFVar1;
  
  if (pCube1->pVar == pCube2->pVar) {
    pFVar1 = (Fxu_Pair *)Fxu_MemFetch(p,0x40);
    pFVar1->pDiv = (Fxu_Double *)0x0;
    pFVar1->pCube1 = (Fxu_Cube *)0x0;
    pFVar1->pCube2 = (Fxu_Cube *)0x0;
    pFVar1->iCube1 = 0;
    pFVar1->iCube2 = 0;
    pFVar1->nLits1 = 0;
    pFVar1->nLits2 = 0;
    *(undefined8 *)&pFVar1->nBase = 0;
    pFVar1->pDPrev = (Fxu_Pair *)0x0;
    pFVar1->pDNext = (Fxu_Pair *)0x0;
    pFVar1->pCube1 = pCube1;
    pFVar1->pCube2 = pCube2;
    pFVar1->iCube1 = pCube1->iCube;
    pFVar1->iCube2 = pCube2->iCube;
    return pFVar1;
  }
  __assert_fail("pCube1->pVar == pCube2->pVar",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuPair.c"
                ,0x20a,"Fxu_Pair *Fxu_PairAlloc(Fxu_Matrix *, Fxu_Cube *, Fxu_Cube *)");
}

Assistant:

Fxu_Pair * Fxu_PairAlloc( Fxu_Matrix * p, Fxu_Cube * pCube1, Fxu_Cube * pCube2 )
{
    Fxu_Pair * pPair;
   	assert( pCube1->pVar == pCube2->pVar );
	pPair = MEM_ALLOC_FXU( p, Fxu_Pair, 1 );
	memset( pPair, 0, sizeof(Fxu_Pair) );
	pPair->pCube1 = pCube1;
	pPair->pCube2 = pCube2;
	pPair->iCube1 = pCube1->iCube;
	pPair->iCube2 = pCube2->iCube;
    return pPair;
}